

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

DragDropMode __thiscall QAbstractItemView::dragDropMode(QAbstractItemView *this)

{
  int iVar1;
  bool bVar2;
  DragDropMode DVar3;
  
  iVar1 = *(int *)(*(long *)(this + 8) + 0x3e0);
  if ((*(char *)(*(long *)(this + 8) + 0x3dc) == '\0') &&
     (bVar2 = QWidget::acceptDrops((QWidget *)this), !bVar2)) {
    return NoDragDrop;
  }
  if ((*(char *)(*(long *)(this + 8) + 0x3dc) == '\x01') &&
     (bVar2 = QWidget::acceptDrops((QWidget *)this), !bVar2)) {
    return DragOnly;
  }
  if ((*(char *)(*(long *)(this + 8) + 0x3dc) == '\0') &&
     (bVar2 = QWidget::acceptDrops((QWidget *)this), bVar2)) {
    return DropOnly;
  }
  DVar3 = NoDragDrop;
  if ((*(char *)(*(long *)(this + 8) + 0x3dc) == '\x01') &&
     (bVar2 = QWidget::acceptDrops((QWidget *)this), bVar2)) {
    DVar3 = (iVar1 == 4) + DragDrop;
  }
  return DVar3;
}

Assistant:

QAbstractItemView::DragDropMode QAbstractItemView::dragDropMode() const
{
    Q_D(const QAbstractItemView);
    DragDropMode setBehavior = d->dragDropMode;
    if (!dragEnabled() && !acceptDrops())
        return NoDragDrop;

    if (dragEnabled() && !acceptDrops())
        return DragOnly;

    if (!dragEnabled() && acceptDrops())
        return DropOnly;

    if (dragEnabled() && acceptDrops()) {
        if (setBehavior == InternalMove)
            return setBehavior;
        else
            return DragDrop;
    }

    return NoDragDrop;
}